

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O2

unique_ptr<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>,_true>
__thiscall
duckdb::ParquetWritePrepareBatch
          (duckdb *this,ClientContext *context,FunctionData *bind_data,GlobalFunctionData *gstate,
          unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
          *collection)

{
  pointer this_00;
  type buffer;
  pointer pPVar1;
  _Head_base<0UL,_duckdb::ParquetWriteBatchData_*,_false> local_20;
  
  make_uniq<duckdb::ParquetWriteBatchData>();
  this_00 = unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>::
            operator->((unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>
                        *)(gstate + 1));
  buffer = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
           ::operator*(collection);
  pPVar1 = unique_ptr<duckdb::ParquetWriteBatchData,_std::default_delete<duckdb::ParquetWriteBatchData>,_true>
           ::operator->((unique_ptr<duckdb::ParquetWriteBatchData,_std::default_delete<duckdb::ParquetWriteBatchData>,_true>
                         *)&local_20);
  ParquetWriter::PrepareRowGroup(this_00,buffer,&pPVar1->prepared_row_group);
  *(ParquetWriteBatchData **)this = local_20._M_head_impl;
  return (unique_ptr<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>)
         (unique_ptr<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>)
         this;
}

Assistant:

unique_ptr<PreparedBatchData> ParquetWritePrepareBatch(ClientContext &context, FunctionData &bind_data,
                                                       GlobalFunctionData &gstate,
                                                       unique_ptr<ColumnDataCollection> collection) {
	auto &global_state = gstate.Cast<ParquetWriteGlobalState>();
	auto result = make_uniq<ParquetWriteBatchData>();
	global_state.writer->PrepareRowGroup(*collection, result->prepared_row_group);
	return std::move(result);
}